

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

int al_ustr_find_chr(ALLEGRO_USTR *us,int start_pos,int32_t c)

{
  size_t sVar1;
  int in_EDX;
  int in_ESI;
  _al_const_bstring in_RDI;
  int rc;
  _al_tagbstring enctb;
  size_t sizec;
  char encc [4];
  int local_44;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  char local_1c [8];
  int local_14;
  _al_const_bstring local_10;
  int local_4;
  
  if (in_EDX < 0x80) {
    local_4 = _al_bstrchrp((_al_const_bstring)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
    if (local_4 == -1) {
      local_4 = -1;
    }
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    sVar1 = al_utf8_encode(local_1c,in_EDX);
    if (sVar1 == 0) {
      al_set_errno(in_stack_ffffffffffffffc4);
      local_4 = -1;
    }
    else {
      local_44 = _al_binstr(local_10,local_14,(_al_const_bstring)&stack0xffffffffffffffc8);
      if (local_44 == -1) {
        local_44 = -1;
      }
      local_4 = local_44;
    }
  }
  return local_4;
}

Assistant:

int al_ustr_find_chr(const ALLEGRO_USTR *us, int start_pos, int32_t c)
{
   char encc[4];
   size_t sizec;
   struct _al_tagbstring enctb;
   int rc;

   /* Fast path for ASCII characters. */
   if (c < 128) {
      rc = _al_bstrchrp(us, c, start_pos);
      return (rc == _AL_BSTR_ERR) ? -1 : rc;
   }

   /* Non-ASCII.  We can simply encode the character into a string and search
    * for that.
    */

   sizec = al_utf8_encode(encc, c);
   if (!sizec) {
      al_set_errno(EINVAL);
      return -1; /* error */
   }

   _al_blk2tbstr(enctb, encc, sizec);
   rc = _al_binstr(us, start_pos, &enctb);
   return (rc == _AL_BSTR_ERR) ? -1 : rc;
}